

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O2

double matlab_std(double *x,int x_length)

{
  ulong uVar1;
  int i;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  uVar2 = 0;
  uVar1 = 0;
  if (0 < x_length) {
    uVar1 = (ulong)(uint)x_length;
  }
  dVar4 = 0.0;
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    dVar4 = dVar4 + x[uVar2];
  }
  dVar3 = 0.0;
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    dVar5 = x[uVar2] - dVar4 / (double)x_length;
    dVar3 = dVar3 + dVar5 * dVar5;
  }
  dVar3 = dVar3 / (double)(x_length + -1);
  if (0.0 <= dVar3) {
    return SQRT(dVar3);
  }
  dVar4 = sqrt(dVar3);
  return dVar4;
}

Assistant:

double matlab_std(const double *x, int x_length) {
  double average = 0.0;
  for (int i = 0; i < x_length; ++i) average += x[i];
  average /= x_length;

  double s = 0.0;
  for (int i = 0; i < x_length; ++i) s += pow(x[i] - average, 2.0);
  s /= (x_length - 1);

  return sqrt(s);
}